

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_refTypeSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t slotIndex;
  sysbvm_context_t *context_00;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if (arguments[1] == 0 || (arguments[1] & 0xf) != 0) {
    sysbvm_error_nullArgument();
  }
  sVar1 = sysbvm_pointerLikeType_load(context,*arguments);
  context_00 = (sysbvm_context_t *)arguments[1];
  slotIndex = sysbvm_typeSlot_getIndex((sysbvm_tuple_t)context_00);
  sVar1 = sysbvm_tuple_slotAt(context_00,sVar1,slotIndex);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_refTypeSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    return sysbvm_tuple_slotAt(context, sysbvm_pointerLikeType_load(context, arguments[0]), sysbvm_typeSlot_getIndex(arguments[1]));
}